

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::Finalize(Segment *this)

{
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  Mode MVar4;
  int iVar5;
  int32 iVar6;
  long lVar7;
  uint64_t uVar8;
  undefined4 extraout_var;
  uint64 value;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  long lVar10;
  uint32_t *puVar11;
  uint64_t *puVar12;
  char *doc_type;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char *name;
  char *local_30;
  
  iVar3 = WriteFramesAll(this);
  if (iVar3 < 0) {
    return false;
  }
  MVar4 = this->mode_;
  if ((MVar4 == kLive) && (this->accurate_cluster_duration_ != true)) {
    return true;
  }
  if (0 < (long)this->cluster_list_size_) {
    if (this->cluster_list_[(long)this->cluster_list_size_ + -1] == (Cluster *)0x0) {
      return false;
    }
    bVar2 = Cluster::Finalize(this->cluster_list_[(long)this->cluster_list_size_ + -1],false,0);
    if (!bVar2) {
      return false;
    }
    MVar4 = this->mode_;
  }
  if (MVar4 == kFile) {
    if ((this->chunking_ == true) && (this->chunk_writer_cluster_ != (MkvWriter *)0x0)) {
      MkvWriter::Close(this->chunk_writer_cluster_);
      this->chunk_count_ = this->chunk_count_ + 1;
    }
    dVar13 = this->duration_;
    if (dVar13 <= 0.0) {
      uVar1 = this->last_block_duration_;
      auVar16._8_4_ = (int)(uVar1 >> 0x20);
      auVar16._0_8_ = uVar1;
      auVar16._12_4_ = 0x45300000;
      uVar8 = (this->segment_info_).timecode_scale_;
      auVar17._8_4_ = (int)(uVar8 >> 0x20);
      auVar17._0_8_ = uVar8;
      auVar17._12_4_ = 0x45300000;
      dVar15 = (auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
      dVar13 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
               ((double)CONCAT44(0x45300000,(int)(this->last_timestamp_ >> 0x20)) -
               1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->last_timestamp_) - 4503599627370496.0)) /
               dVar15;
      if (((uVar1 == 0) && (this->estimate_file_duration_ == true)) &&
         (lVar7 = (long)(int)(this->tracks_).track_entries_size_, 0 < lVar7)) {
        lVar9 = 0;
        dVar14 = dVar13;
        do {
          dVar13 = dVar14;
          if (1 < this->track_frames_written_[lVar9]) {
            uVar8 = this->last_track_timestamp_[lVar9];
            auVar18._8_4_ = (int)(uVar8 >> 0x20);
            auVar18._0_8_ = uVar8;
            auVar18._12_4_ = 0x45300000;
            dVar13 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
            lVar10 = this->track_frames_written_[lVar9] - 1;
            auVar19._8_4_ = (int)((ulong)lVar10 >> 0x20);
            auVar19._0_8_ = lVar10;
            auVar19._12_4_ = 0x45300000;
            dVar13 = (dVar13 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) +
                     dVar13) / dVar15;
            if (dVar13 <= dVar14) {
              dVar13 = dVar14;
            }
          }
          lVar9 = lVar9 + 1;
          dVar14 = dVar13;
        } while (lVar7 != lVar9);
      }
    }
    (this->segment_info_).duration_ = dVar13;
    bVar2 = SegmentInfo::Finalize(&this->segment_info_,this->writer_header_);
    if (!bVar2) {
      return false;
    }
    if (this->output_cues_ == true) {
      uVar8 = MaxOffset(this);
      if ((this->seek_head_).seek_entry_id_[0] == 0) {
        (this->seek_head_).seek_entry_id_[0] = 0x1c53bb6b;
        puVar12 = (this->seek_head_).seek_entry_pos_;
      }
      else {
        puVar11 = (this->seek_head_).seek_entry_id_;
        lVar7 = 0;
        do {
          puVar11 = puVar11 + 1;
          if (lVar7 == -0x20) {
            return false;
          }
          lVar7 = lVar7 + -8;
        } while (*puVar11 != 0);
        *puVar11 = 0x1c53bb6b;
        puVar12 = (uint64_t *)((long)this + (0x38 - lVar7));
      }
      *puVar12 = uVar8;
    }
    if (this->chunking_ == true) {
      if (this->chunk_writer_cues_ == (MkvWriter *)0x0) {
        return false;
      }
      local_30 = (char *)0x0;
      bVar2 = UpdateChunkName(this,"cues",&local_30);
      if (!bVar2) {
        return false;
      }
      bVar2 = MkvWriter::Open(this->chunk_writer_cues_,local_30);
      if (local_30 != (char *)0x0) {
        operator_delete__(local_30);
      }
      if (!bVar2) {
        return false;
      }
    }
    iVar3 = (*this->writer_cluster_->_vptr_IMkvWriter[1])();
    this->cluster_end_offset_ = CONCAT44(extraout_var,iVar3);
    if ((this->output_cues_ == true) &&
       (bVar2 = Cues::Write(&this->cues_,this->writer_cues_), !bVar2)) {
      return false;
    }
    bVar2 = SeekHead::Finalize(&this->seek_head_,this->writer_header_);
    if (!bVar2) {
      return false;
    }
    iVar3 = (*this->writer_header_->_vptr_IMkvWriter[3])();
    if ((char)iVar3 != '\0') {
      if (this->size_position_ == -1) {
        return false;
      }
      value = MaxOffset(this);
      if ((long)value < 1) {
        return false;
      }
      iVar3 = (*this->writer_header_->_vptr_IMkvWriter[1])();
      UpdateDocTypeVersion(this);
      if (this->doc_type_version_ != this->doc_type_version_written_) {
        iVar5 = (*this->writer_header_->_vptr_IMkvWriter[2])(this->writer_header_,0);
        if (iVar5 != 0) {
          return false;
        }
        bVar2 = DocTypeIsWebm(this);
        doc_type = "matroska";
        if (bVar2) {
          doc_type = "webm";
        }
        bVar2 = WriteEbmlHeader(this->writer_header_,(ulong)this->doc_type_version_,doc_type);
        if (!bVar2) {
          return false;
        }
        iVar5 = (*this->writer_header_->_vptr_IMkvWriter[1])();
        if (CONCAT44(extraout_var_01,iVar5) != (long)this->ebml_header_size_) {
          return false;
        }
        this->doc_type_version_written_ = this->doc_type_version_;
      }
      iVar5 = (*this->writer_header_->_vptr_IMkvWriter[2])
                        (this->writer_header_,this->size_position_);
      if (iVar5 != 0) {
        return false;
      }
      iVar6 = WriteUIntSize(this->writer_header_,value,8);
      if (iVar6 != 0) {
        return false;
      }
      iVar3 = (*this->writer_header_->_vptr_IMkvWriter[2])
                        (this->writer_header_,CONCAT44(extraout_var_00,iVar3));
      if (iVar3 != 0) {
        return false;
      }
    }
    if (this->chunking_ == true) {
      if ((this->chunk_writer_cues_ == (MkvWriter *)0x0) ||
         (this->chunk_writer_header_ == (MkvWriter *)0x0)) {
        return false;
      }
      MkvWriter::Close(this->chunk_writer_cues_);
      MkvWriter::Close(this->chunk_writer_header_);
    }
  }
  return true;
}

Assistant:

bool Segment::Finalize() {
  if (WriteFramesAll() < 0)
    return false;

  // In kLive mode, call Cluster::Finalize only if |accurate_cluster_duration_|
  // is set. In all other modes, always call Cluster::Finalize.
  if ((mode_ == kLive ? accurate_cluster_duration_ : true) &&
      cluster_list_size_ > 0) {
    // Update last cluster's size
    Cluster* const old_cluster = cluster_list_[cluster_list_size_ - 1];

    // For the last frame of the last Cluster, we don't write it as a BlockGroup
    // with Duration unless the frame itself has duration set explicitly.
    if (!old_cluster || !old_cluster->Finalize(false, 0))
      return false;
  }

  if (mode_ == kFile) {
    if (chunking_ && chunk_writer_cluster_) {
      chunk_writer_cluster_->Close();
      chunk_count_++;
    }

    double duration =
        (static_cast<double>(last_timestamp_) + last_block_duration_) /
        segment_info_.timecode_scale();
    if (duration_ > 0.0) {
      duration = duration_;
    } else {
      if (last_block_duration_ == 0 && estimate_file_duration_) {
        const int num_tracks = static_cast<int>(tracks_.track_entries_size());
        for (int i = 0; i < num_tracks; ++i) {
          if (track_frames_written_[i] < 2)
            continue;

          // Estimate the duration for the last block of a Track.
          const double nano_per_frame =
              static_cast<double>(last_track_timestamp_[i]) /
              (track_frames_written_[i] - 1);
          const double track_duration =
              (last_track_timestamp_[i] + nano_per_frame) /
              segment_info_.timecode_scale();
          if (track_duration > duration)
            duration = track_duration;
        }
      }
    }
    segment_info_.set_duration(duration);
    if (!segment_info_.Finalize(writer_header_))
      return false;

    if (output_cues_)
      if (!seek_head_.AddSeekEntry(libwebm::kMkvCues, MaxOffset()))
        return false;

    if (chunking_) {
      if (!chunk_writer_cues_)
        return false;

      char* name = NULL;
      if (!UpdateChunkName("cues", &name))
        return false;

      const bool cues_open = chunk_writer_cues_->Open(name);
      delete[] name;
      if (!cues_open)
        return false;
    }

    cluster_end_offset_ = writer_cluster_->Position();

    // Write the seek headers and cues
    if (output_cues_)
      if (!cues_.Write(writer_cues_))
        return false;

    if (!seek_head_.Finalize(writer_header_))
      return false;

    if (writer_header_->Seekable()) {
      if (size_position_ == -1)
        return false;

      const int64_t segment_size = MaxOffset();
      if (segment_size < 1)
        return false;

      const int64_t pos = writer_header_->Position();
      UpdateDocTypeVersion();
      if (doc_type_version_ != doc_type_version_written_) {
        if (writer_header_->Position(0))
          return false;

        const char* const doc_type =
            DocTypeIsWebm() ? kDocTypeWebm : kDocTypeMatroska;
        if (!WriteEbmlHeader(writer_header_, doc_type_version_, doc_type))
          return false;
        if (writer_header_->Position() != ebml_header_size_)
          return false;

        doc_type_version_written_ = doc_type_version_;
      }

      if (writer_header_->Position(size_position_))
        return false;

      if (WriteUIntSize(writer_header_, segment_size, 8))
        return false;

      if (writer_header_->Position(pos))
        return false;
    }

    if (chunking_) {
      // Do not close any writers until the segment size has been written,
      // otherwise the size may be off.
      if (!chunk_writer_cues_ || !chunk_writer_header_)
        return false;

      chunk_writer_cues_->Close();
      chunk_writer_header_->Close();
    }
  }

  return true;
}